

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESoinn.cpp
# Opt level: O1

void __thiscall
nn::ESoinn::findClustersMCL
          (ESoinn *this,
          vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          *clusters)

{
  int iVar1;
  char *__nptr;
  ConcreteLogger *this_00;
  char cVar2;
  long *plVar3;
  istream *piVar4;
  int *piVar5;
  ulong uVar6;
  runtime_error *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_type *psVar8;
  undefined8 uVar9;
  pointer *Input;
  undefined1 local_328 [8];
  ifstream fi;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_318;
  byte abStack_308 [488];
  char *local_120;
  anon_union_16_2_ba345be5_for_m_Storage local_118;
  ulong local_108;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_100;
  undefined1 local_f8 [8];
  string output_mcl;
  string options;
  string command;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  uint local_6c;
  undefined1 auStack_68 [4];
  uint32_t neuron_num;
  vector<unsigned_int,_std::allocator<unsigned_int>_> one_cluster;
  string line;
  
  this_00 = log_netw;
  local_328 = (undefined1  [8])&local_318;
  local_100 = clusters;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_328,"findClusterMCL function","");
  logger::ConcreteLogger::debug(this_00,(string *)local_328,false);
  if (local_328 != (undefined1  [8])&local_318) {
    operator_delete((void *)local_328);
  }
  exportEdgesFile(this,(string *)&output_src_mcl_abi_cxx11_);
  local_f8 = (undefined1  [8])&output_mcl._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"mcl_clusters.tmp","");
  output_mcl.field_2._8_8_ = &options._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)((long)&output_mcl.field_2 + 8)," -I 3.0 --abc -o ","");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &mcl_path_abi_cxx11_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &output_src_mcl_abi_cxx11_);
  plVar3 = (long *)std::__cxx11::string::_M_append
                             ((char *)&one_cluster.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                              output_mcl.field_2._8_8_);
  paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 == paVar7) {
    local_318._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_318._8_8_ = plVar3[3];
    local_328 = (undefined1  [8])&local_318;
  }
  else {
    local_318._M_allocated_capacity = paVar7->_M_allocated_capacity;
    local_328 = (undefined1  [8])*plVar3;
  }
  _fi = plVar3[1];
  *plVar3 = (long)paVar7;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  plVar3 = (long *)std::__cxx11::string::_M_append(local_328,(ulong)local_f8);
  options.field_2._8_8_ = &command._M_string_length;
  psVar8 = (size_type *)(plVar3 + 2);
  if ((size_type *)*plVar3 == psVar8) {
    command._M_string_length = *psVar8;
    command.field_2._M_allocated_capacity = plVar3[3];
  }
  else {
    command._M_string_length = *psVar8;
    options.field_2._8_8_ = (size_type *)*plVar3;
  }
  command._M_dataplus._M_p = (pointer)plVar3[1];
  *plVar3 = (long)psVar8;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if (local_328 != (undefined1  [8])&local_318) {
    operator_delete((void *)local_328);
  }
  if ((size_type *)
      one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage != &line._M_string_length) {
    operator_delete(one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
  }
  system((char *)options.field_2._8_8_);
  std::ifstream::ifstream(local_328,(string *)local_f8,_S_in);
  if ((abStack_308[*(long *)((long)local_328 + -0x18)] & 5) != 0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&command.field_2 + 8),"Can\'t read mcl output file. File ",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
    plVar3 = (long *)std::__cxx11::string::append(command.field_2._M_local_buf + 8);
    one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)*plVar3;
    psVar8 = (size_type *)(plVar3 + 2);
    if ((size_type *)
        one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage == psVar8) {
      line._M_string_length = *psVar8;
      line.field_2._M_allocated_capacity = plVar3[3];
      one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)&line._M_string_length;
    }
    else {
      line._M_string_length = *psVar8;
    }
    line._M_dataplus._M_p = (pointer)plVar3[1];
    *plVar3 = (long)psVar8;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::runtime_error::runtime_error
              (this_01,(string *)
                       &one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
    __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&line._M_string_length;
  line._M_dataplus._M_p = (pointer)0x0;
  line._M_string_length = line._M_string_length & 0xffffffffffffff00;
  do {
    Input = &one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    cVar2 = std::ios::widen((char)*(undefined8 *)((long)local_328 + -0x18) +
                            (char)(istream *)local_328);
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_328,(string *)Input,cVar2);
    if ((((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) ||
       (line._M_dataplus._M_p == (pointer)0x0)) {
      if ((size_type *)
          one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage != &line._M_string_length) {
        operator_delete(one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
      std::ifstream::~ifstream(local_328);
      if ((size_type *)options.field_2._8_8_ != &command._M_string_length) {
        operator_delete((void *)options.field_2._8_8_);
      }
      if ((size_type *)output_mcl.field_2._8_8_ != &options._M_string_length) {
        operator_delete((void *)output_mcl.field_2._8_8_);
      }
      if (local_f8 != (undefined1  [8])&output_mcl._M_string_length) {
        operator_delete((void *)local_f8);
      }
      return;
    }
    command.field_2._8_8_ = 0;
    _auStack_68 = (pointer)0x13b25e;
    one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x13b25f;
    boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
              ((is_any_ofF<char> *)&local_118,(iterator_range<const_char_*> *)auStack_68);
    boost::algorithm::
    split<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::__cxx11::string&,boost::algorithm::detail::is_any_ofF<char>>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&command.field_2 + 8),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)Input,
               (is_any_ofF<char> *)&local_118,token_compress_off);
    if ((0x10 < local_108) && (local_118.m_dynSet != (set_value_type *)0x0)) {
      operator_delete__(local_118.m_dynSet);
    }
    uVar9 = command.field_2._8_8_;
    _auStack_68 = (pointer)0x0;
    one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    if (command.field_2._8_8_ != 0) {
      piVar5 = __errno_location();
      do {
        __nptr = *(char **)uVar9;
        iVar1 = *piVar5;
        *piVar5 = 0;
        uVar6 = strtoul(__nptr,&local_120,10);
        if (local_120 == __nptr) {
          std::__throw_invalid_argument("stoul");
LAB_00132833:
          std::__throw_out_of_range("stoul");
        }
        if (*piVar5 == 0) {
          *piVar5 = iVar1;
        }
        else if (*piVar5 == 0x22) goto LAB_00132833;
        local_6c = (uint)uVar6;
        if (one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start ==
            one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          std::vector<unsigned_int,std::allocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,std::allocator<unsigned_int>> *)auStack_68,
                     (iterator)
                     one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,&local_6c);
        }
        else {
          *one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start = local_6c;
          one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start =
               one_cluster.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start + 1;
        }
        uVar9 = uVar9 + 0x20;
      } while ((undefined8 *)uVar9 != (undefined8 *)0x0);
    }
    std::
    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_back(local_100,(value_type *)auStack_68);
    if (_auStack_68 != (pointer)0x0) {
      operator_delete(_auStack_68);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&command.field_2 + 8));
  } while( true );
}

Assistant:

void ESoinn::findClustersMCL(std::vector<std::vector<uint32_t>>& clusters) const
    {
        log_netw->debug("findClusterMCL function");
        
        //prepare input data for mcl
        exportEdgesFile(output_src_mcl);
    
        //run mcl algorithm
        std::string output_mcl = "mcl_clusters.tmp";    
        std::string options = " -I 3.0 --abc -o ";
        std::string command = mcl_path + output_src_mcl + options + output_mcl;
        system(command.c_str());
        
        //read output mcl file and form results
        std::ifstream fi(output_mcl);
        if (not fi)
            throw std::runtime_error("Can't read mcl output file. File " + output_mcl + " is not found");
        
        std::string line;
        while (std::getline(fi, line) and !line.empty())
        {
            std::vector<std::string> items;
            boost::split(items, line, boost::is_any_of("\t"));
            std::vector<uint32_t> one_cluster;
            for (const std::string& s: items)
            {
                uint32_t neuron_num = std::stoul(s);
                one_cluster.push_back(neuron_num);
            }
            clusters.push_back(one_cluster);
        }

        //remove temporary files
        //std::remove(output_src_mcl.c_str());
        //std::remove(output_mcl.c_str());
    }